

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xatlas.cpp
# Opt level: O3

void __thiscall xatlas::internal::ArrayBase::insertAt(ArrayBase *this,uint32_t index,uint8_t *value)

{
  uint32_t uVar1;
  uint uVar2;
  uint8_t *puVar3;
  int iVar4;
  uint uVar5;
  
  if (this->size < index) {
    __assert_fail("index >= 0 && index <= size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/vicfergar[P]XAtlasSharp/src/XAtlas/xatlas.cpp"
                  ,999,"void xatlas::internal::ArrayBase::insertAt(uint32_t, const uint8_t *)");
  }
  if (value != (uint8_t *)0x0) {
    uVar2 = this->size + 1;
    this->size = uVar2;
    if (this->capacity < uVar2) {
      uVar5 = uVar2 >> 2;
      if (this->capacity == 0) {
        uVar5 = 0;
      }
      setArrayCapacity(this,uVar5 + uVar2);
    }
    puVar3 = this->buffer;
    if (puVar3 != (uint8_t *)0x0) {
      uVar2 = this->size - 1;
      iVar4 = uVar2 - index;
      if (index <= uVar2 && iVar4 != 0) {
        uVar1 = this->elementSize;
        memmove(puVar3 + (index + 1) * uVar1,puVar3 + uVar1 * index,(ulong)(iVar4 * uVar1));
        puVar3 = this->buffer;
        if (puVar3 == (uint8_t *)0x0) {
          return;
        }
      }
      memcpy(puVar3 + index * this->elementSize,value,(ulong)this->elementSize);
      return;
    }
    __assert_fail("buffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/vicfergar[P]XAtlasSharp/src/XAtlas/xatlas.cpp"
                  ,0x3ea,"void xatlas::internal::ArrayBase::insertAt(uint32_t, const uint8_t *)");
  }
  __assert_fail("value",
                "/workspace/llm4binary/github/license_all_cmakelists_25/vicfergar[P]XAtlasSharp/src/XAtlas/xatlas.cpp"
                ,1000,"void xatlas::internal::ArrayBase::insertAt(uint32_t, const uint8_t *)");
}

Assistant:

void insertAt(uint32_t index, const uint8_t *value)
	{
		XA_DEBUG_ASSERT(index >= 0 && index <= size);
		XA_DEBUG_ASSERT(value);
		resize(size + 1, false);
		XA_DEBUG_ASSERT(buffer);
		if (buffer && index < size - 1)
			memmove(buffer + elementSize * (index + 1), buffer + elementSize * index, elementSize * (size - 1 - index));
		if (buffer && value)
			memcpy(&buffer[index * elementSize], value, elementSize);
	}